

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float64 float64_round_to_int_s390x(float64 a,float_status *s)

{
  float64 fVar1;
  FloatParts FVar2;
  FloatParts pr;
  FloatParts pa;
  float_status *s_local;
  float64 a_local;
  
  FVar2 = float64_unpack_canonical(a,s);
  FVar2 = round_to_int(FVar2,(int)s->float_rounding_mode,0,s);
  fVar1 = float64_round_pack_canonical(FVar2,s);
  return fVar1;
}

Assistant:

float64 float64_round_to_int(float64 a, float_status *s)
{
    FloatParts pa = float64_unpack_canonical(a, s);
    FloatParts pr = round_to_int(pa, s->float_rounding_mode, 0, s);
    return float64_round_pack_canonical(pr, s);
}